

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmShiftEa<(moira::Instr)69,(moira::Mode)8,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  undefined2 in_CX;
  StrWriter *in_RSI;
  long in_RDI;
  Ea<(moira::Mode)8,_(moira::Size)2> src;
  Align align;
  undefined4 in_stack_ffffffffffffffcc;
  StrWriter *in_stack_ffffffffffffffd0;
  u16 in_stack_ffffffffffffffde;
  undefined6 in_stack_ffffffffffffffe0;
  
  Op<(moira::Mode)8,(moira::Size)2>
            ((Moira *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde,
             (u32 *)in_stack_ffffffffffffffd0);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  align.raw = *(int *)(in_RDI + 0x14);
  StrWriter::operator<<(pSVar1,align);
  StrWriter::operator<<
            (in_stack_ffffffffffffffd0,
             (Ea<(moira::Mode)8,_(moira::Size)2> *)CONCAT44(in_stack_ffffffffffffffcc,align.raw));
  return;
}

Assistant:

void
Moira::dasmShiftEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src;
}